

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::int_writer
          (int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_> *this,
          basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *w,
          wchar_t value,basic_format_specs<wchar_t> *s)

{
  type_conflict1 tVar1;
  bool bVar2;
  char local_31;
  basic_format_specs<wchar_t> *s_local;
  wchar_t value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *w_local;
  int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_> *this_local;
  
  this->writer = w;
  this->spec = s;
  this->abs_value = value;
  this->prefix_size = 0;
  tVar1 = internal::is_negative<wchar_t>(value);
  if (tVar1) {
    this->prefix[0] = '-';
    this->prefix_size = this->prefix_size + 1;
    this->abs_value = -this->abs_value;
  }
  else {
    bVar2 = core_format_specs::has(&this->spec->super_core_format_specs,1);
    if (bVar2) {
      bVar2 = core_format_specs::has(&this->spec->super_core_format_specs,2);
      local_31 = '+';
      if (!bVar2) {
        local_31 = ' ';
      }
      this->prefix[0] = local_31;
      this->prefix_size = this->prefix_size + 1;
    }
  }
  return;
}

Assistant:

int_writer(basic_writer<Range> &w, Int value, const Spec &s)
      : writer(w), spec(s), abs_value(static_cast<unsigned_type>(value)),
        prefix_size(0) {
      if (internal::is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (spec.has(SIGN_FLAG)) {
        prefix[0] = spec.has(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
      }
    }